

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

void Nwk_ManUpdateLevel(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *p_00;
  int iVar1;
  int i;
  Nwk_Obj_t *pObj_00;
  Nwk_Obj_t *pObj_01;
  long lVar2;
  int i_00;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x305,"void Nwk_ManUpdateLevel(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  p_00 = pObj->pMan->vTemp;
  p_00->nSize = 0;
  Vec_PtrPush(p_00,pObj);
  pObj->field_0x20 = pObj->field_0x20 | 0x10;
  i_00 = 0;
  pObj_01 = (Nwk_Obj_t *)0x0;
  do {
    if (p_00->nSize <= i_00) {
      return;
    }
    pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(p_00,i_00);
    pObj_00->field_0x20 = pObj_00->field_0x20 & 0xef;
    iVar1 = Nwk_ObjLevelNew(pObj_00);
    if (iVar1 != pObj_00->Level) {
      pObj_00->Level = iVar1;
      if ((*(uint *)&pObj_00->field_0x20 & 7) == 2) {
        if ((p != (Tim_Man_t *)0x0) &&
           (iVar1 = Tim_ManBoxForCo(p,*(uint *)&pObj_00->field_0x20 >> 7), -1 < iVar1)) {
          Tim_ManSetCurrentTravIdBoxInputs(p,iVar1);
          i = Tim_ManBoxOutputFirst(p,iVar1);
          iVar1 = Tim_ManBoxOutputNum(p,iVar1);
          if (iVar1 < 1) {
            iVar1 = 0;
          }
          while (iVar1 != 0) {
            pObj_01 = Nwk_ManCi(pObj_01->pMan,i);
            if ((pObj_01->field_0x20 & 0x10) == 0) {
              Nwk_NodeUpdateAddToQueue(p_00,pObj_01,i_00,1);
              pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
            }
            i = i + 1;
            iVar1 = iVar1 + -1;
          }
        }
      }
      else {
        for (lVar2 = 0; (int)lVar2 < pObj_00->nFanouts; lVar2 = lVar2 + 1) {
          pObj_01 = pObj_00->pFanio[pObj_00->nFanins + lVar2];
          if (pObj_01 == (Nwk_Obj_t *)0x0) {
            pObj_01 = (Nwk_Obj_t *)0x0;
            break;
          }
          if ((pObj_01->field_0x20 & 0x10) == 0) {
            Nwk_NodeUpdateAddToQueue(p_00,pObj_01,i_00,1);
            pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
          }
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Nwk_ManUpdateLevel( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    int LevelNew, iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // initialize the queue with the node
    Vec_PtrClear( vQueue );
    Vec_PtrPush( vQueue, pObj );
    pObj->MarkA = 1;
    // process objects
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        LevelNew = Nwk_ObjLevelNew( pTemp );
        if ( LevelNew == Nwk_ObjLevel(pTemp) )
            continue;
        Nwk_ObjSetLevel( pTemp, LevelNew );
        // add the fanouts to the queue
        if ( Nwk_ObjIsCo(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCo( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this is not a true PO
                {
                    Tim_ManSetCurrentTravIdBoxInputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxOutputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCi(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                pNext->MarkA = 1;
            }
        }
    }
}